

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int FnCompare_double(void *v1,void *v2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*v2 <= *v1) {
    uVar1 = (uint)(*v2 < *v1);
  }
  return uVar1;
}

Assistant:

static int FnCompare_double(const void *v1, const void *v2)
{
   const double *i1 = v1;
   const double *i2 = v2;
   
   if (*i1 < *i2)
     return(-1);
   else if (*i1 > *i2)
     return(1);
   else
     return(0);
}